

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absUtil.c
# Opt level: O0

Vec_Int_t * Gia_VtaConvertToGla(Gia_Man_t *p,Vec_Int_t *vVta)

{
  uint uVar1;
  int Entry_00;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *p_00;
  Gia_Obj_t *pObj_00;
  int nFrames;
  int Entry;
  int i;
  int nObjs;
  int nObjMask;
  Vec_Int_t *vGla;
  Gia_Obj_t *pObj;
  Vec_Int_t *vVta_local;
  Gia_Man_t *p_local;
  
  uVar1 = Gia_ManObjNum(p);
  Entry_00 = Vec_IntEntry(vVta,0);
  iVar2 = Vec_IntEntry(vVta,Entry_00 + 1);
  iVar3 = Vec_IntSize(vVta);
  if (iVar2 != iVar3) {
    __assert_fail("Vec_IntEntry(vVta, nFrames+1) == Vec_IntSize(vVta)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absUtil.c"
                  ,0x54,"Vec_Int_t *Gia_VtaConvertToGla(Gia_Man_t *, Vec_Int_t *)");
  }
  iVar2 = Abc_Base2Log(uVar1);
  uVar4 = (1 << ((byte)iVar2 & 0x1f)) - 1;
  if ((int)uVar4 < (int)uVar1) {
    __assert_fail("nObjs <= nObjMask",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absUtil.c"
                  ,0x57,"Vec_Int_t *Gia_VtaConvertToGla(Gia_Man_t *, Vec_Int_t *)");
  }
  p_00 = Vec_IntStart(uVar1);
  nFrames = Entry_00 + 2;
  while( true ) {
    iVar2 = Vec_IntSize(vVta);
    if (iVar2 <= nFrames) {
      Vec_IntWriteEntry(p_00,0,Entry_00);
      return p_00;
    }
    uVar1 = Vec_IntEntry(vVta,nFrames);
    pObj_00 = Gia_ManObj(p,uVar1 & uVar4);
    iVar2 = Gia_ObjIsRo(p,pObj_00);
    if (((iVar2 == 0) && (iVar2 = Gia_ObjIsAnd(pObj_00), iVar2 == 0)) &&
       (iVar2 = Gia_ObjIsConst0(pObj_00), iVar2 == 0)) break;
    Vec_IntAddToEntry(p_00,uVar1 & uVar4,1);
    nFrames = nFrames + 1;
  }
  __assert_fail("Gia_ObjIsRo(p, pObj) || Gia_ObjIsAnd(pObj) || Gia_ObjIsConst0(pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absUtil.c"
                ,0x5d,"Vec_Int_t *Gia_VtaConvertToGla(Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

Vec_Int_t * Gia_VtaConvertToGla( Gia_Man_t * p, Vec_Int_t * vVta )
{
    Gia_Obj_t * pObj;
    Vec_Int_t * vGla;
    int nObjMask, nObjs = Gia_ManObjNum(p);
    int i, Entry, nFrames = Vec_IntEntry( vVta, 0 );
    assert( Vec_IntEntry(vVta, nFrames+1) == Vec_IntSize(vVta) );
    // get the bitmask
    nObjMask = (1 << Abc_Base2Log(nObjs)) - 1;
    assert( nObjs <= nObjMask );
    // go through objects
    vGla = Vec_IntStart( nObjs );
    Vec_IntForEachEntryStart( vVta, Entry, i, nFrames+2 )
    {
        pObj = Gia_ManObj( p, (Entry &  nObjMask) );
        assert( Gia_ObjIsRo(p, pObj) || Gia_ObjIsAnd(pObj) || Gia_ObjIsConst0(pObj) );
        Vec_IntAddToEntry( vGla, (Entry &  nObjMask), 1 );
    }
    Vec_IntWriteEntry( vGla, 0, nFrames );
    return vGla;
}